

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covBuild.c
# Opt level: O1

Abc_Obj_t * Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *p,Abc_Ntk_t *pNtkNew,Abc_Obj_t *pObj,int fCompl)

{
  Vec_Int_t *vSupp;
  Vec_Ptr_t *pVVar1;
  Min_Cube_t *pMVar2;
  Abc_Obj_t *pFanin;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  long lVar5;
  int iVar6;
  Min_Cube_t *pCube;
  
  if ((pObj->field_6).pTemp == (void *)0x0) {
    if ((*(uint *)&pObj->field_0x14 & 0xf) != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                    ,0x136,
                    "Abc_Obj_t *Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, int)"
                   );
    }
    iVar6 = pObj->Id;
    if (((long)iVar6 < 0) ||
       (lVar5 = *(long *)((long)pObj->pNtk->pManCut + 0x18), *(int *)(lVar5 + 4) <= iVar6)) {
LAB_008c4ba4:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    lVar5 = *(long *)(*(long *)(lVar5 + 8) + (long)iVar6 * 8);
    vSupp = *(Vec_Int_t **)(lVar5 + 0x18);
    if (vSupp == (Vec_Int_t *)0x0) {
      __assert_fail("vSupp",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covBuild.c"
                    ,0x13b,
                    "Abc_Obj_t *Abc_NtkCovDeriveNodeInv_rec(Cov_Man_t *, Abc_Ntk_t *, Abc_Obj_t *, int)"
                   );
    }
    pCube = *(Min_Cube_t **)(lVar5 + 0x10);
    if (0 < vSupp->nSize) {
      lVar5 = 0;
      do {
        iVar6 = vSupp->pArray[lVar5];
        if (((long)iVar6 < 0) || (pVVar1 = pObj->pNtk->vObjs, pVVar1->nSize <= iVar6))
        goto LAB_008c4ba4;
        Abc_NtkCovDeriveNodeInv_rec(p,pNtkNew,(Abc_Obj_t *)pVVar1->pArray[iVar6],0);
        lVar5 = lVar5 + 1;
      } while (lVar5 < vSupp->nSize);
    }
    iVar6 = 0;
    for (pMVar2 = pCube; pMVar2 != (Min_Cube_t *)0x0; pMVar2 = pMVar2->pNext) {
      iVar6 = iVar6 + 1;
    }
    if (iVar6 == 1) {
      pAVar4 = Abc_NtkCovDeriveCubeInv(pNtkNew,pObj,pCube,vSupp);
    }
    else if (iVar6 == 0) {
      pAVar4 = Abc_NtkCreateNodeConst0(pNtkNew);
    }
    else {
      pAVar4 = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_NODE);
      for (; pCube != (Min_Cube_t *)0x0; pCube = pCube->pNext) {
        pFanin = Abc_NtkCovDeriveCubeInv(pNtkNew,pObj,pCube,vSupp);
        Abc_ObjAddFanin(pAVar4,pFanin);
      }
      pcVar3 = Abc_SopCreateXorSpecial((Mem_Flex_t *)pNtkNew->pManFunc,iVar6);
      (pAVar4->field_5).pData = pcVar3;
    }
    (pObj->field_6).pCopy = pAVar4;
  }
  pAVar4 = Abc_NtkCovDeriveInv(pNtkNew,pObj,fCompl);
  return pAVar4;
}

Assistant:

Abc_Obj_t * Abc_NtkCovDeriveNodeInv_rec( Cov_Man_t * p, Abc_Ntk_t * pNtkNew, Abc_Obj_t * pObj, int fCompl )
{
    Min_Cube_t * pCover, * pCube;
    Abc_Obj_t * pFaninNew, * pNodeNew, * pFanin;
    Vec_Int_t * vSupp;
    int Entry, nCubes, i;

    // skip if already computed
    if ( pObj->pCopy )
        return Abc_NtkCovDeriveInv( pNtkNew, pObj, fCompl );
    assert( Abc_ObjIsNode(pObj) );

    // get the support and the cover
    vSupp  = Abc_ObjGetSupp( pObj ); 
    pCover = Abc_ObjGetCover2( pObj );
    assert( vSupp );

    // process the fanins
    Vec_IntForEachEntry( vSupp, Entry, i )
    {
        pFanin = Abc_NtkObj(pObj->pNtk, Entry);
        Abc_NtkCovDeriveNodeInv_rec( p, pNtkNew, pFanin, 0 );
    }

    // for each cube, construct the node
    nCubes = Min_CoverCountCubes( pCover );
    if ( nCubes == 0 )
        pNodeNew = Abc_NtkCreateNodeConst0(pNtkNew);
    else if ( nCubes == 1 )
        pNodeNew = Abc_NtkCovDeriveCubeInv( pNtkNew, pObj, pCover, vSupp );
    else
    {
        pNodeNew = Abc_NtkCreateNode( pNtkNew );
        Min_CoverForEachCube( pCover, pCube )
        {
            pFaninNew = Abc_NtkCovDeriveCubeInv( pNtkNew, pObj, pCube, vSupp );
            Abc_ObjAddFanin( pNodeNew, pFaninNew );
        }
        pNodeNew->pData = Abc_SopCreateXorSpecial( (Mem_Flex_t *)pNtkNew->pManFunc, nCubes );
    }

    pObj->pCopy = pNodeNew;
    return Abc_NtkCovDeriveInv( pNtkNew, pObj, fCompl );
}